

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readokt.c
# Opt level: O0

DUMB_IT_SIGDATA * it_okt_load_sigdata(DUMBFILE *f)

{
  short sVar1;
  uchar uVar2;
  int32 iVar3;
  uint uVar4;
  int iVar5;
  IFF_CHUNKED *mod_00;
  IFF_CHUNK *pIVar6;
  IT_SAMPLE *pIVar7;
  uchar *puVar8;
  IT_PATTERN *pIVar9;
  int iVar10;
  bool bVar11;
  char signature [8];
  IFF_CHUNK *chunk;
  IFF_CHUNKED *mod;
  int l;
  int k;
  int j;
  int i;
  int n_channels;
  DUMB_IT_SIGDATA *sigdata;
  int in_stack_ffffffffffffffac;
  undefined5 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb5;
  undefined1 in_stack_ffffffffffffffb6;
  undefined1 in_stack_ffffffffffffffb7;
  undefined1 uVar12;
  DUMB_IT_SIGDATA *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  uint offset;
  uint local_20;
  int local_1c;
  DUMB_IT_SIGDATA *local_8;
  
  iVar3 = dumbfile_getnc(in_stack_ffffffffffffffc8,(int32)((ulong)in_stack_ffffffffffffffc0 >> 0x20)
                         ,(DUMBFILE *)in_stack_ffffffffffffffb8);
  if ((iVar3 < 8) || (in_stack_ffffffffffffffb8 != (DUMB_IT_SIGDATA *)0x474e4f5341544b4f)) {
    local_8 = (DUMB_IT_SIGDATA *)0x0;
  }
  else {
    mod_00 = dumbfile_read_okt((DUMBFILE *)0x474e4f5341544b4f);
    if (mod_00 == (IFF_CHUNKED *)0x0) {
      local_8 = (DUMB_IT_SIGDATA *)0x0;
    }
    else {
      local_8 = (DUMB_IT_SIGDATA *)malloc(0x138);
      if (local_8 == (DUMB_IT_SIGDATA *)0x0) {
        free_okt((IFF_CHUNKED *)
                 CONCAT17(in_stack_ffffffffffffffb7,
                          CONCAT16(in_stack_ffffffffffffffb6,
                                   CONCAT15(in_stack_ffffffffffffffb5,in_stack_ffffffffffffffb0))));
        local_8 = (DUMB_IT_SIGDATA *)0x0;
      }
      else {
        local_8->name[0] = '\0';
        pIVar6 = get_chunk_by_type(mod_00,0x53504545,0);
        if ((pIVar6 == (IFF_CHUNK *)0x0) || (pIVar6->size < 2)) {
          free(local_8);
          free_okt((IFF_CHUNKED *)
                   CONCAT17(in_stack_ffffffffffffffb7,
                            CONCAT16(in_stack_ffffffffffffffb6,
                                     CONCAT15(in_stack_ffffffffffffffb5,in_stack_ffffffffffffffb0)))
                  );
          local_8 = (DUMB_IT_SIGDATA *)0x0;
        }
        else {
          local_8->speed = (uint)CONCAT11(*pIVar6->data,pIVar6->data[1]);
          pIVar6 = get_chunk_by_type(mod_00,0x53414d50,0);
          if ((pIVar6 == (IFF_CHUNK *)0x0) || (pIVar6->size < 0x20)) {
            free(local_8);
            free_okt((IFF_CHUNKED *)
                     CONCAT17(in_stack_ffffffffffffffb7,
                              CONCAT16(in_stack_ffffffffffffffb6,
                                       CONCAT15(in_stack_ffffffffffffffb5,in_stack_ffffffffffffffb0)
                                      )));
            local_8 = (DUMB_IT_SIGDATA *)0x0;
          }
          else {
            local_8->n_samples = pIVar6->size >> 5;
            pIVar6 = get_chunk_by_type(mod_00,0x434d4f44,0);
            if ((pIVar6 == (IFF_CHUNK *)0x0) || (pIVar6->size < 8)) {
              free(local_8);
              free_okt((IFF_CHUNKED *)
                       CONCAT17(in_stack_ffffffffffffffb7,
                                CONCAT16(in_stack_ffffffffffffffb6,
                                         CONCAT15(in_stack_ffffffffffffffb5,
                                                  in_stack_ffffffffffffffb0))));
              local_8 = (DUMB_IT_SIGDATA *)0x0;
            }
            else {
              local_1c = 0;
              for (local_20 = 0; (int)local_20 < 4; local_20 = local_20 + 1) {
                sVar1 = CONCAT11(pIVar6->data[(int)(local_20 << 1)],
                                 pIVar6->data[(int)(local_20 * 2 + 1)]);
                if (sVar1 == 0) {
                  local_1c = local_1c + 1;
                }
                else if (sVar1 == 1) {
                  local_1c = local_1c + 2;
                }
              }
              if (local_1c == 0) {
                free(local_8);
                free_okt((IFF_CHUNKED *)
                         CONCAT17(in_stack_ffffffffffffffb7,
                                  CONCAT16(in_stack_ffffffffffffffb6,
                                           CONCAT15(in_stack_ffffffffffffffb5,
                                                    in_stack_ffffffffffffffb0))));
                local_8 = (DUMB_IT_SIGDATA *)0x0;
              }
              else {
                local_8->n_pchannels = local_1c;
                pIVar7 = (IT_SAMPLE *)malloc((long)local_8->n_samples * 0x68);
                local_8->sample = pIVar7;
                if (local_8->sample == (IT_SAMPLE *)0x0) {
                  free(local_8);
                  free_okt((IFF_CHUNKED *)
                           CONCAT17(in_stack_ffffffffffffffb7,
                                    CONCAT16(in_stack_ffffffffffffffb6,
                                             CONCAT15(in_stack_ffffffffffffffb5,
                                                      in_stack_ffffffffffffffb0))));
                  local_8 = (DUMB_IT_SIGDATA *)0x0;
                }
                else {
                  local_8->song_message = (uchar *)0x0;
                  local_8->order = (uchar *)0x0;
                  local_8->instrument = (IT_INSTRUMENT *)0x0;
                  local_8->pattern = (IT_PATTERN *)0x0;
                  local_8->midi = (IT_MIDI *)0x0;
                  local_8->checkpoint = (IT_CHECKPOINT *)0x0;
                  local_8->n_instruments = 0;
                  for (local_20 = 0; local_20 < (uint)local_8->n_samples; local_20 = local_20 + 1) {
                    local_8->sample[(int)local_20].data = (void *)0x0;
                  }
                  pIVar6 = get_chunk_by_type(mod_00,0x53414d50,0);
                  for (local_20 = 0; local_20 < (uint)local_8->n_samples; local_20 = local_20 + 1) {
                    it_okt_read_sample_header
                              (local_8->sample + (int)local_20,pIVar6->data + (int)(local_20 << 5));
                  }
                  local_8->restart_position = '\0';
                  pIVar6 = get_chunk_by_type(mod_00,0x504c454e,0);
                  if ((pIVar6 == (IFF_CHUNK *)0x0) || (pIVar6->size < 2)) {
                    _dumb_it_unload_sigdata(pIVar6);
                    free_okt((IFF_CHUNKED *)
                             CONCAT17(in_stack_ffffffffffffffb7,
                                      CONCAT16(in_stack_ffffffffffffffb6,
                                               CONCAT15(in_stack_ffffffffffffffb5,
                                                        in_stack_ffffffffffffffb0))));
                    local_8 = (DUMB_IT_SIGDATA *)0x0;
                  }
                  else {
                    local_8->n_orders = (uint)CONCAT11(*pIVar6->data,pIVar6->data[1]);
                    if ((local_8->n_orders < 1) || (0x80 < local_8->n_orders)) {
                      _dumb_it_unload_sigdata(pIVar6);
                      free_okt((IFF_CHUNKED *)
                               CONCAT17(in_stack_ffffffffffffffb7,
                                        CONCAT16(in_stack_ffffffffffffffb6,
                                                 CONCAT15(in_stack_ffffffffffffffb5,
                                                          in_stack_ffffffffffffffb0))));
                      local_8 = (DUMB_IT_SIGDATA *)0x0;
                    }
                    else {
                      pIVar6 = get_chunk_by_type(mod_00,0x50415454,0);
                      if ((pIVar6 == (IFF_CHUNK *)0x0) || (pIVar6->size < (uint)local_8->n_orders))
                      {
                        _dumb_it_unload_sigdata(pIVar6);
                        free_okt((IFF_CHUNKED *)
                                 CONCAT17(in_stack_ffffffffffffffb7,
                                          CONCAT16(in_stack_ffffffffffffffb6,
                                                   CONCAT15(in_stack_ffffffffffffffb5,
                                                            in_stack_ffffffffffffffb0))));
                        local_8 = (DUMB_IT_SIGDATA *)0x0;
                      }
                      else {
                        puVar8 = (uchar *)malloc((long)local_8->n_orders);
                        local_8->order = puVar8;
                        if (local_8->order == (uchar *)0x0) {
                          _dumb_it_unload_sigdata(pIVar6);
                          free_okt((IFF_CHUNKED *)
                                   CONCAT17(in_stack_ffffffffffffffb7,
                                            CONCAT16(in_stack_ffffffffffffffb6,
                                                     CONCAT15(in_stack_ffffffffffffffb5,
                                                              in_stack_ffffffffffffffb0))));
                          local_8 = (DUMB_IT_SIGDATA *)0x0;
                        }
                        else {
                          memcpy(local_8->order,pIVar6->data,(long)local_8->n_orders);
                          pIVar6 = get_chunk_by_type(mod_00,0x534c454e,0);
                          if ((pIVar6 == (IFF_CHUNK *)0x0) || (pIVar6->size < 2)) {
                            _dumb_it_unload_sigdata(pIVar6);
                            free_okt((IFF_CHUNKED *)
                                     CONCAT17(in_stack_ffffffffffffffb7,
                                              CONCAT16(in_stack_ffffffffffffffb6,
                                                       CONCAT15(in_stack_ffffffffffffffb5,
                                                                in_stack_ffffffffffffffb0))));
                            local_8 = (DUMB_IT_SIGDATA *)0x0;
                          }
                          else {
                            local_8->n_patterns = (uint)CONCAT11(*pIVar6->data,pIVar6->data[1]);
                            uVar4 = get_chunk_count(mod_00,0x50424f44);
                            if ((int)uVar4 < local_8->n_patterns) {
                              local_8->n_patterns = uVar4;
                            }
                            if (local_8->n_patterns == 0) {
                              _dumb_it_unload_sigdata(pIVar6);
                              free_okt((IFF_CHUNKED *)
                                       CONCAT17(in_stack_ffffffffffffffb7,
                                                CONCAT16(in_stack_ffffffffffffffb6,
                                                         CONCAT15(in_stack_ffffffffffffffb5,
                                                                  in_stack_ffffffffffffffb0))));
                              local_8 = (DUMB_IT_SIGDATA *)0x0;
                            }
                            else {
                              pIVar9 = (IT_PATTERN *)malloc((long)local_8->n_patterns << 4);
                              local_8->pattern = pIVar9;
                              if (local_8->pattern == (IT_PATTERN *)0x0) {
                                _dumb_it_unload_sigdata(pIVar6);
                                free_okt((IFF_CHUNKED *)
                                         CONCAT17(in_stack_ffffffffffffffb7,
                                                  CONCAT16(in_stack_ffffffffffffffb6,
                                                           CONCAT15(in_stack_ffffffffffffffb5,
                                                                    in_stack_ffffffffffffffb0))));
                                local_8 = (DUMB_IT_SIGDATA *)0x0;
                              }
                              else {
                                for (local_20 = 0; local_20 < (uint)local_8->n_patterns;
                                    local_20 = local_20 + 1) {
                                  local_8->pattern[(int)local_20].entry = (IT_ENTRY *)0x0;
                                }
                                for (local_20 = 0; local_20 < (uint)local_8->n_patterns;
                                    local_20 = local_20 + 1) {
                                  pIVar6 = get_chunk_by_type(mod_00,0x50424f44,local_20);
                                  iVar5 = it_okt_read_pattern((IT_PATTERN *)
                                                              CONCAT44(uVar4,
                                                  in_stack_ffffffffffffffd8),
                                                  (uchar *)CONCAT44(in_stack_ffffffffffffffd4,
                                                                    in_stack_ffffffffffffffd0),
                                                  (int)((ulong)mod_00 >> 0x20),(int)mod_00);
                                  if (iVar5 != 0) {
                                    _dumb_it_unload_sigdata(pIVar6);
                                    free_okt((IFF_CHUNKED *)
                                             CONCAT17(in_stack_ffffffffffffffb7,
                                                      CONCAT16(in_stack_ffffffffffffffb6,
                                                               CONCAT15(in_stack_ffffffffffffffb5,
                                                                        in_stack_ffffffffffffffb0)))
                                            );
                                    return (DUMB_IT_SIGDATA *)0x0;
                                  }
                                }
                                uVar4 = get_chunk_count(mod_00,0x53424f44);
                                offset = 0;
                                for (local_20 = 0; bVar11 = local_20 < (uint)local_8->n_samples,
                                    uVar12 = bVar11 && (int)offset < (int)uVar4,
                                    bVar11 && (int)offset < (int)uVar4; local_20 = local_20 + 1) {
                                  if ((local_8->sample[(int)local_20].flags & 1) != 0) {
                                    pIVar6 = get_chunk_by_type(mod_00,0x53424f44,offset);
                                    iVar5 = it_okt_read_sample_data
                                                      ((IT_SAMPLE *)in_stack_ffffffffffffffb8,
                                                       (char *)CONCAT17(uVar12,CONCAT16(
                                                  in_stack_ffffffffffffffb6,
                                                  CONCAT15(in_stack_ffffffffffffffb5,
                                                           in_stack_ffffffffffffffb0))),
                                                  in_stack_ffffffffffffffac);
                                    if (iVar5 != 0) {
                                      _dumb_it_unload_sigdata(pIVar6);
                                      free_okt((IFF_CHUNKED *)
                                               CONCAT17(uVar12,CONCAT16(in_stack_ffffffffffffffb6,
                                                                        CONCAT15(
                                                  in_stack_ffffffffffffffb5,
                                                  in_stack_ffffffffffffffb0))));
                                      return (DUMB_IT_SIGDATA *)0x0;
                                    }
                                    offset = offset + 1;
                                  }
                                }
                                for (; local_20 < (uint)local_8->n_samples; local_20 = local_20 + 1)
                                {
                                  local_8->sample[(int)local_20].flags = '\0';
                                }
                                pIVar6 = get_chunk_by_type(mod_00,0x434d4f44,0);
                                local_20 = 0;
                                for (iVar5 = 0; (int)local_20 < local_1c && iVar5 < 4;
                                    iVar5 = iVar5 + 1) {
                                  sVar1 = CONCAT11(pIVar6->data[iVar5 << 1],
                                                   pIVar6->data[iVar5 * 2 + 1]);
                                  in_stack_ffffffffffffffb5 = iVar5 == 1 || iVar5 == 2;
                                  uVar2 = '\x10';
                                  if (iVar5 == 1 || iVar5 == 2) {
                                    uVar2 = '0';
                                  }
                                  if (sVar1 == 0) {
                                    local_8->channel_pan[(int)local_20] = uVar2;
                                    local_20 = local_20 + 1;
                                  }
                                  else if (sVar1 == 1) {
                                    iVar10 = local_20 + 1;
                                    local_8->channel_pan[(int)local_20] = uVar2;
                                    local_20 = local_20 + 2;
                                    local_8->channel_pan[iVar10] = uVar2;
                                  }
                                }
                                free_okt((IFF_CHUNKED *)
                                         CONCAT17(uVar12,CONCAT16((int)local_20 < local_1c &&
                                                                  iVar5 < 4,
                                                                  CONCAT15(in_stack_ffffffffffffffb5
                                                                           ,
                                                  in_stack_ffffffffffffffb0))));
                                local_8->flags = 0x8f1;
                                local_8->global_volume = 0x80;
                                local_8->mixing_volume = 0x30;
                                local_8->tempo = 0x7d;
                                local_8->pan_separation = 0x80;
                                memset(local_8->channel_volume,0x40,0x40);
                                memset(local_8->channel_pan + local_1c,0x20,(long)(0x40 - local_1c))
                                ;
                                _dumb_it_fix_invalid_orders(in_stack_ffffffffffffffb8);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_8;
}

Assistant:

static DUMB_IT_SIGDATA *it_okt_load_sigdata(DUMBFILE *f)
{
	DUMB_IT_SIGDATA *sigdata;
    int n_channels;
    int i, j, k, l;
	IFF_CHUNKED *mod;
	const IFF_CHUNK *chunk;

	char signature[8];

	if (dumbfile_getnc(signature, 8, f) < 8 ||
		memcmp(signature, "OKTASONG", 8)) {
		return NULL;
	}

	mod = dumbfile_read_okt(f);
	if (!mod)
		return NULL;

	sigdata = (DUMB_IT_SIGDATA *) malloc(sizeof(*sigdata));
	if (!sigdata) {
		free_okt(mod);
		return NULL;
	}

	sigdata->name[0] = 0;

	chunk = get_chunk_by_type(mod, DUMB_ID('S','P','E','E'), 0);
	if (!chunk || chunk->size < 2) {
		free(sigdata);
		free_okt(mod);
		return NULL;
	}

	sigdata->speed = (chunk->data[0] << 8) | chunk->data[1];

	chunk = get_chunk_by_type(mod, DUMB_ID('S','A','M','P'), 0);
	if (!chunk || chunk->size < 32) {
		free(sigdata);
		free_okt(mod);
		return NULL;
	}

	sigdata->n_samples = chunk->size / 32;

	chunk = get_chunk_by_type(mod, DUMB_ID('C','M','O','D'), 0);
	if (!chunk || chunk->size < 8) {
		free(sigdata);
		free_okt(mod);
		return NULL;
	}

	n_channels = 0;

	for (i = 0; i < 4; i++) {
		j = (chunk->data[i * 2] << 8) | chunk->data[i * 2 + 1];
		if (!j) n_channels++;
		else if (j == 1) n_channels += 2;
	}

	if (!n_channels) {
		free(sigdata);
		free_okt(mod);
		return NULL;
	}

	sigdata->n_pchannels = n_channels;

	sigdata->sample = (IT_SAMPLE *) malloc(sigdata->n_samples * sizeof(*sigdata->sample));
	if (!sigdata->sample) {
		free(sigdata);
		free_okt(mod);
		return NULL;
	}

	sigdata->song_message = NULL;
	sigdata->order = NULL;
	sigdata->instrument = NULL;
	sigdata->pattern = NULL;
	sigdata->midi = NULL;
	sigdata->checkpoint = NULL;

	sigdata->n_instruments = 0;

	for (i = 0; (unsigned)i < (unsigned)sigdata->n_samples; i++)
		sigdata->sample[i].data = NULL;

	chunk = get_chunk_by_type(mod, DUMB_ID('S','A','M','P'), 0);

	for (i = 0; (unsigned)i < (unsigned)sigdata->n_samples; i++) {
		it_okt_read_sample_header(&sigdata->sample[i], chunk->data + 32 * i);
	}

	sigdata->restart_position = 0;

	chunk = get_chunk_by_type(mod, DUMB_ID('P','L','E','N'), 0);
	if (!chunk || chunk->size < 2) {
		_dumb_it_unload_sigdata(sigdata);
		free_okt(mod);
		return NULL;
	}

	sigdata->n_orders = (chunk->data[0] << 8) | chunk->data[1];
	// what if this is > 128?

	if (sigdata->n_orders <= 0 || sigdata->n_orders > 128) {
		_dumb_it_unload_sigdata(sigdata);
		free_okt(mod);
		return NULL;
	}

	chunk = get_chunk_by_type(mod, DUMB_ID('P','A','T','T'), 0);
    if (!chunk || chunk->size < (unsigned)sigdata->n_orders) {
		_dumb_it_unload_sigdata(sigdata);
		free_okt(mod);
		return NULL;
	}

	sigdata->order = (unsigned char *) malloc(sigdata->n_orders);
	if (!sigdata->order) {
		_dumb_it_unload_sigdata(sigdata);
		free_okt(mod);
		return NULL;
	}

	memcpy(sigdata->order, chunk->data, sigdata->n_orders);

	/* Work out how many patterns there are. */
	chunk = get_chunk_by_type(mod, DUMB_ID('S','L','E','N'), 0);
	if (!chunk || chunk->size < 2) {
		_dumb_it_unload_sigdata(sigdata);
		free_okt(mod);
		return NULL;
	}

	sigdata->n_patterns = (chunk->data[0] << 8) | chunk->data[1];

	j = get_chunk_count(mod, DUMB_ID('P','B','O','D'));
	if (sigdata->n_patterns > (int)j) sigdata->n_patterns = (int)j;

	if (!sigdata->n_patterns) {
		_dumb_it_unload_sigdata(sigdata);
		free_okt(mod);
		return NULL;
	}

	sigdata->pattern = (IT_PATTERN *) malloc(sigdata->n_patterns * sizeof(*sigdata->pattern));
	if (!sigdata->pattern) {
		_dumb_it_unload_sigdata(sigdata);
		free_okt(mod);
		return NULL;
	}
	for (i = 0; (unsigned)i < (unsigned)sigdata->n_patterns; i++)
		sigdata->pattern[i].entry = NULL;

	/* Read in the patterns */
	for (i = 0; (unsigned)i < (unsigned)sigdata->n_patterns; i++) {
		chunk = get_chunk_by_type(mod, DUMB_ID('P','B','O','D'), i);
		if (it_okt_read_pattern(&sigdata->pattern[i], chunk->data, chunk->size, n_channels) != 0) {
			_dumb_it_unload_sigdata(sigdata);
			free_okt(mod);
			return NULL;
		}
	}

	/* And finally, the sample data */
	k = get_chunk_count(mod, DUMB_ID('S','B','O','D'));
	for (i = 0, j = 0; (unsigned)i < (unsigned)sigdata->n_samples && j < k; i++) {
		if (sigdata->sample[i].flags & IT_SAMPLE_EXISTS) {
			chunk = get_chunk_by_type(mod, DUMB_ID('S','B','O','D'), j);
			if (it_okt_read_sample_data(&sigdata->sample[i], (const char *)chunk->data, chunk->size)) {
				_dumb_it_unload_sigdata(sigdata);
				free_okt(mod);
				return NULL;
			}
			j++;
		}
	}
	for (; (unsigned)i < (unsigned)sigdata->n_samples; i++) {
		sigdata->sample[i].flags = 0;
	}

	chunk = get_chunk_by_type(mod, DUMB_ID('C','M','O','D'), 0);

	for (i = 0, j = 0; i < n_channels && j < 4; j++) {
		k = (chunk->data[j * 2] << 8) | chunk->data[j * 2 + 1];
		l = (j == 1 || j == 2) ? 48 : 16;
		if (k == 0) {
			sigdata->channel_pan[i++] = l;
		}
		else if (k == 1) {
			sigdata->channel_pan[i++] = l;
			sigdata->channel_pan[i++] = l;
		}
	}

	free_okt(mod);

	/* Now let's initialise the remaining variables, and we're done! */
	sigdata->flags = IT_WAS_AN_OKT | IT_WAS_AN_XM | IT_WAS_A_MOD | IT_OLD_EFFECTS | IT_COMPATIBLE_GXX | IT_STEREO;

	sigdata->global_volume = 128;
	sigdata->mixing_volume = 48;
	/* We want 50 ticks per second; 50/6 row advances per second;
	 * 50*10=500 row advances per minute; 500/4=125 beats per minute.
	 */
	sigdata->tempo = 125;
	sigdata->pan_separation = 128;

	memset(sigdata->channel_volume, 64, DUMB_IT_N_CHANNELS);
	memset(sigdata->channel_pan + n_channels, 32, DUMB_IT_N_CHANNELS - n_channels);

	_dumb_it_fix_invalid_orders(sigdata);

	return sigdata;
}